

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_start_dsp(void)

{
  t_symbol *ptVar1;
  _glist *local_10;
  _glist *x;
  
  if ((pd_maininstance.pd_gui)->i_dspstate == 0) {
    pdgui_vmess("pdtk_pd_dsp","s","ON");
  }
  else {
    ugen_stop();
  }
  ugen_start();
  for (local_10 = pd_getcanvaslist(); local_10 != (_glist *)0x0; local_10 = local_10->gl_next) {
    canvas_dodsp(local_10,1,(t_signal **)0x0);
  }
  (pd_maininstance.pd_gui)->i_dspstate = 1;
  canvas_dspstate = 1;
  ptVar1 = gensym("pd-dsp-started");
  if (ptVar1->s_thing != (_class **)0x0) {
    ptVar1 = gensym("pd-dsp-started");
    pd_bang(ptVar1->s_thing);
  }
  return;
}

Assistant:

static void canvas_start_dsp(void)
{
    t_canvas *x;
    if (THISGUI->i_dspstate) ugen_stop();
    else pdgui_vmess("pdtk_pd_dsp", "s", "ON");
    ugen_start();

    for (x = pd_getcanvaslist(); x; x = x->gl_next)
        canvas_dodsp(x, 1, 0);

    canvas_dspstate = THISGUI->i_dspstate = 1;
    if (gensym("pd-dsp-started")->s_thing)
        pd_bang(gensym("pd-dsp-started")->s_thing);
}